

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureLog.cxx
# Opt level: O1

void __thiscall
cmConfigureLog::WriteValue
          (cmConfigureLog *this,string_view key,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *list)

{
  ofstream *poVar1;
  pointer pbVar2;
  StreamWriter *pSVar3;
  uint uVar4;
  pointer value;
  Value local_58;
  
  BeginObject(this,key);
  value = (list->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (list->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (value != pbVar2) {
    poVar1 = &this->Stream;
    do {
      if (this->Indent != 0) {
        uVar4 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"  ",2);
          uVar4 = uVar4 + 1;
        } while (uVar4 < this->Indent);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"- ",2);
      pSVar3 = (this->Encoder)._M_t.
               super___uniq_ptr_impl<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>.
               _M_t.
               super__Tuple_impl<0UL,_Json::StreamWriter_*,_std::default_delete<Json::StreamWriter>_>
               .super__Head_base<0UL,_Json::StreamWriter_*,_false>._M_head_impl;
      Json::Value::Value(&local_58,value);
      (*pSVar3->_vptr_StreamWriter[2])(pSVar3,&local_58,poVar1);
      Json::Value::~Value(&local_58);
      EndLine(this);
      value = value + 1;
    } while (value != pbVar2);
  }
  if (this->Indent != 0) {
    this->Indent = this->Indent - 1;
    return;
  }
  __assert_fail("this->Indent",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmConfigureLog.cxx"
                ,0x87,"void cmConfigureLog::EndObject()");
}

Assistant:

void cmConfigureLog::WriteValue(cm::string_view key,
                                std::vector<std::string> const& list)
{
  this->BeginObject(key);
  for (auto const& value : list) {
    this->BeginLine() << "- ";
    this->Encoder->write(value, &this->Stream);
    this->EndLine();
  }
  this->EndObject();
}